

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestMutualRecursionA_SubGroup::Clear(TestMutualRecursionA_SubGroup *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestMutualRecursionA_SubGroup *pTStack_18;
  uint32_t cached_has_bits;
  TestMutualRecursionA_SubGroup *this_local;
  
  this_local = (TestMutualRecursionA_SubGroup *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 3) != 0) {
    if ((local_1c & 1) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.sub_message_ == (TestMutualRecursionA_SubMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x5613,"_impl_.sub_message_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      TestMutualRecursionA_SubMessage::Clear((this->field_0)._impl_.sub_message_);
    }
    if ((local_1c & 2) != 0) {
      if ((this->field_0)._impl_.not_in_this_scc_ == (TestAllTypes *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x5617,"_impl_.not_in_this_scc_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      edition_unittest::TestAllTypes::Clear((this->field_0)._impl_.not_in_this_scc_);
    }
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMutualRecursionA_SubGroup::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestMutualRecursionA.SubGroup)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.sub_message_ != nullptr);
      _impl_.sub_message_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.not_in_this_scc_ != nullptr);
      _impl_.not_in_this_scc_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}